

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::calcUnnormalizedCoordRange
               (Vec4 *coord,IVec3 *levelSize,FloatFormat *internalFormat,Vec3 *unnormalizedCoordMin,
               Vec3 *unnormalizedCoordMax)

{
  int *piVar1;
  float *pfVar2;
  double dVar3;
  Interval local_b0;
  Interval local_98;
  undefined1 local_80 [8];
  Interval unnormalizedCoordInterval;
  double local_50;
  Interval coordInterval;
  int size;
  int compNdx;
  Vec3 *unnormalizedCoordMax_local;
  Vec3 *unnormalizedCoordMin_local;
  FloatFormat *internalFormat_local;
  IVec3 *levelSize_local;
  Vec4 *coord_local;
  
  for (coordInterval.m_hi._4_4_ = 0; coordInterval.m_hi._4_4_ < 3;
      coordInterval.m_hi._4_4_ = coordInterval.m_hi._4_4_ + 1) {
    piVar1 = tcu::Vector<int,_3>::operator[](levelSize,coordInterval.m_hi._4_4_);
    coordInterval.m_hi._0_4_ = *piVar1;
    pfVar2 = tcu::Vector<float,_4>::operator[](coord,coordInterval.m_hi._4_4_);
    tcu::Interval::Interval((Interval *)&local_50,(double)*pfVar2);
    tcu::FloatFormat::roundOut
              ((Interval *)&unnormalizedCoordInterval.m_hi,internalFormat,(Interval *)&local_50,
               false);
    local_50 = unnormalizedCoordInterval.m_hi;
    tcu::Interval::Interval(&local_98,(double)coordInterval.m_hi._0_4_);
    tcu::operator*((Interval *)local_80,(Interval *)&local_50,&local_98);
    tcu::FloatFormat::roundOut(&local_b0,internalFormat,(Interval *)local_80,false);
    local_80 = (undefined1  [8])local_b0._0_8_;
    unnormalizedCoordInterval._0_8_ = local_b0.m_lo;
    unnormalizedCoordInterval.m_lo = local_b0.m_hi;
    dVar3 = tcu::Interval::lo((Interval *)local_80);
    pfVar2 = tcu::Vector<float,_3>::operator[](unnormalizedCoordMin,coordInterval.m_hi._4_4_);
    *pfVar2 = (float)dVar3;
    dVar3 = tcu::Interval::hi((Interval *)local_80);
    pfVar2 = tcu::Vector<float,_3>::operator[](unnormalizedCoordMax,coordInterval.m_hi._4_4_);
    *pfVar2 = (float)dVar3;
  }
  return;
}

Assistant:

void calcUnnormalizedCoordRange (const Vec4&		coord,
								 const IVec3&		levelSize,
								 const FloatFormat& internalFormat,
								 Vec3&				unnormalizedCoordMin,
								 Vec3&				unnormalizedCoordMax)
{
    for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const int size = levelSize[compNdx];

		Interval coordInterval = Interval(coord[compNdx]);
		coordInterval = internalFormat.roundOut(coordInterval, false);

		Interval unnormalizedCoordInterval = coordInterval * Interval((double) size);
		unnormalizedCoordInterval = internalFormat.roundOut(unnormalizedCoordInterval, false);

		unnormalizedCoordMin[compNdx] = (float)unnormalizedCoordInterval.lo();
		unnormalizedCoordMax[compNdx] = (float)unnormalizedCoordInterval.hi();
	}
}